

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * __thiscall
despot::util::tinyxml::TiXmlComment::Parse
          (TiXmlComment *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlString *this_00;
  bool bVar1;
  TiXmlDocument *this_01;
  char *pcVar2;
  
  this_01 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  this_00 = &(this->super_TiXmlNode).value;
  TiXmlString::operator=(this_00,"");
  pcVar2 = TiXmlBase::SkipWhiteSpace(p,encoding);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,pcVar2,encoding);
    (this->super_TiXmlNode).super_TiXmlBase.location = data->cursor;
  }
  bVar1 = TiXmlBase::StringEqual(pcVar2,"<!--",false,encoding);
  if (bVar1) {
    TiXmlString::operator=(this_00,"");
    for (pcVar2 = pcVar2 + 4; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
      bVar1 = TiXmlBase::StringEqual(pcVar2,"-->",false,encoding);
      if (bVar1) break;
      TiXmlString::append(this_00,pcVar2,1);
    }
    pcVar2 = pcVar2 + 3;
  }
  else {
    TiXmlDocument::SetError(this_01,0xb,pcVar2,data,encoding);
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* TiXmlComment::Parse(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	TiXmlDocument* document = GetDocument();
	value = "";

	p = SkipWhiteSpace(p, encoding);

	if (data) {
		data->Stamp(p, encoding);
		location = data->Cursor();
	}
	const char* startTag = "<!--";
	const char* endTag = "-->";

	if (!StringEqual(p, startTag, false, encoding)) {
		document->SetError(TIXML_ERROR_PARSING_COMMENT, p, data, encoding);
		return 0;
	}
	p += strlen(startTag);

	// [ 1475201 ] TinyXML parses entities in comments
	// Oops - ReadText doesn't work, because we don't want to parse the entities.
	// p = ReadText( p, &value, false, endTag, false, encoding );
	//
	// from the XML spec:
	/*
	 [Definition: Comments may appear anywhere in a document outside other markup; in addition,
	 they may appear within the document type declaration at places allowed by the grammar.
	 They are not part of the document's character data; an XML processor MAY, but need not,
	 make it possible for an application to retrieve the text of comments. For compatibility,
	 the string "--" (double-hyphen) MUST NOT occur within comments.] Parameter entity
	 references MUST NOT be recognized within comments.

	 An example of a comment:

	 <!-- declarations for <head> & <body> -->
	 */

	value = "";
	// Keep all the white space.
	while (p && *p && !StringEqual(p, endTag, false, encoding)) {
		value.append(p, 1);
		++p;
	}
	if (p)
		p += strlen(endTag);

	return p;
}